

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *name,
         pair<const_void_*,_int> value)

{
  string *sub_symbol;
  bool bVar1;
  LogMessage *pLVar2;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>,_bool>
  pVar4;
  bool local_201;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
  local_188;
  const_iterator local_158;
  LogFinisher local_149;
  LogMessage local_148;
  _Self local_110;
  LogFinisher local_101;
  LogMessage local_100;
  _Base_ptr local_c8;
  undefined1 local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
  local_b8;
  _Self local_88;
  _Self local_80;
  iterator iter;
  LogMessage local_68;
  string *local_30;
  string *name_local;
  DescriptorIndex<std::pair<const_void_*,_int>_> *this_local;
  pair<const_void_*,_int> value_local;
  
  this_local = (DescriptorIndex<std::pair<const_void_*,_int>_> *)value.first;
  value_local.first._0_4_ = value.second;
  local_30 = name;
  name_local = (string *)this;
  bVar1 = ValidateSymbolName(this,name);
  if (bVar1) {
    local_80._M_node = (_Base_ptr)FindLastLessOrEqual(this,local_30);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
         ::end(&this->by_symbol_);
    bVar1 = std::operator==(&local_80,&local_88);
    if (bVar1) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
      ::pair<std::pair<const_void_*,_int>_&,_true>
                (&local_b8,local_30,(pair<const_void_*,_int> *)&this_local);
      pVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
              ::insert(&this->by_symbol_,&local_b8);
      local_c8 = (_Base_ptr)pVar4.first._M_node;
      local_c0 = pVar4.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
      ::~pair(&local_b8);
      value_local._15_1_ = 1;
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
               ::operator->(&local_80);
      bVar1 = IsSubSymbol(this,&ppVar3->first,local_30);
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_100,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x6e);
        pLVar2 = internal::LogMessage::operator<<(&local_100,"Symbol name \"");
        pLVar2 = internal::LogMessage::operator<<(pLVar2,local_30);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,"\" conflicts with the existing symbol \"")
        ;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                 ::operator->(&local_80);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,&ppVar3->first);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,"\".");
        internal::LogFinisher::operator=(&local_101,pLVar2);
        internal::LogMessage::~LogMessage(&local_100);
        value_local._15_1_ = 0;
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
        ::operator++(&local_80);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
             ::end(&this->by_symbol_);
        bVar1 = std::operator!=(&local_80,&local_110);
        sub_symbol = local_30;
        local_201 = false;
        if (bVar1) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                   ::operator->(&local_80);
          local_201 = IsSubSymbol(this,sub_symbol,&ppVar3->first);
        }
        if (local_201 == false) {
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
          ::_Rb_tree_const_iterator(&local_158,&local_80);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
          ::pair<std::pair<const_void_*,_int>_&,_true>
                    (&local_188,local_30,(pair<const_void_*,_int> *)&this_local);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
          ::insert(&this->by_symbol_,local_158,&local_188);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>
          ::~pair(&local_188);
          value_local._15_1_ = 1;
        }
        else {
          internal::LogMessage::LogMessage
                    (&local_148,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x7b);
          pLVar2 = internal::LogMessage::operator<<(&local_148,"Symbol name \"");
          pLVar2 = internal::LogMessage::operator<<(pLVar2,local_30);
          pLVar2 = internal::LogMessage::operator<<
                             (pLVar2,"\" conflicts with the existing symbol \"");
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>
                   ::operator->(&local_80);
          pLVar2 = internal::LogMessage::operator<<(pLVar2,&ppVar3->first);
          pLVar2 = internal::LogMessage::operator<<(pLVar2,"\".");
          internal::LogFinisher::operator=(&local_149,pLVar2);
          internal::LogMessage::~LogMessage(&local_148);
          value_local._15_1_ = 0;
        }
      }
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x5e);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"Invalid symbol name: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,local_30);
    internal::LogFinisher::operator=((LogFinisher *)((long)&iter._M_node + 3),pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
    value_local._15_1_ = 0;
  }
  return (bool)value_local._15_1_;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  typename std::map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter,
                    typename std::map<string, Value>::value_type(name, value));

  return true;
}